

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.h
# Opt level: O1

void __thiscall jaegertracing::net::http::Header::~Header(Header *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->_value)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_value).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_key)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_key).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Header() = default;